

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_traverse_sequence_of
              (uchar **p,uchar *end,uchar tag_must_mask,uchar tag_must_val,uchar tag_may_mask,
              uchar tag_may_val,_func_int_void_ptr_int_uchar_ptr_size_t *cb,void *ctx)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  size_t sStack_30;
  uchar tag;
  size_t len;
  int ret;
  uchar tag_may_val_local;
  uchar tag_may_mask_local;
  uchar tag_must_val_local;
  uchar tag_must_mask_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_1_ = tag_may_val;
  len._5_1_ = tag_may_mask;
  len._6_1_ = tag_must_val;
  len._7_1_ = tag_must_mask;
  _ret = end;
  end_local = (uchar *)p;
  p_local._4_4_ = mbedtls_asn1_get_tag(p,end,&stack0xffffffffffffffd0,0x30);
  if (p_local._4_4_ == 0) {
    if ((uchar *)(*(long *)end_local + sStack_30) == _ret) {
      while (len._0_4_ = 0, *(uchar **)end_local < _ret) {
        pbVar2 = *(byte **)end_local;
        *(byte **)end_local = pbVar2 + 1;
        bVar1 = *pbVar2;
        if ((bVar1 & len._7_1_) != len._6_1_) {
          return -0x62;
        }
        len._0_4_ = mbedtls_asn1_get_len((uchar **)end_local,_ret,&stack0xffffffffffffffd0);
        if ((int)len != 0) {
          return (int)len;
        }
        if ((((bVar1 & len._5_1_) == len._4_1_) &&
            (cb != (_func_int_void_ptr_int_uchar_ptr_size_t *)0x0)) &&
           (iVar3 = (*cb)(ctx,(int)bVar1,*(uchar **)end_local,sStack_30), iVar3 != 0)) {
          return iVar3;
        }
        *(size_t *)end_local = sStack_30 + *(long *)end_local;
      }
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = -0x66;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_traverse_sequence_of(
    unsigned char **p,
    const unsigned char *end,
    unsigned char tag_must_mask, unsigned char tag_must_val,
    unsigned char tag_may_mask, unsigned char tag_may_val,
    int (*cb)( void *ctx, int tag,
               unsigned char *start, size_t len ),
    void *ctx )
{
    int ret;
    size_t len;

    /* Get main sequence tag */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( ret );
    }

    if( *p + len != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    while( *p < end )
    {
        unsigned char const tag = *(*p)++;

        if( ( tag & tag_must_mask ) != tag_must_val )
            return( MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

        if( ( ret = mbedtls_asn1_get_len( p, end, &len ) ) != 0 )
            return( ret );

        if( ( tag & tag_may_mask ) == tag_may_val )
        {
            if( cb != NULL )
            {
                ret = cb( ctx, tag, *p, len );
                if( ret != 0 )
                    return( ret );
            }
        }

        *p += len;
    }

    return( 0 );
}